

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O0

IRNode * __thiscall kratos::Generator::get_child(Generator *this,uint64_t index)

{
  uint64_t uVar1;
  __shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2> *this_00;
  size_type sVar2;
  mapped_type *pmVar3;
  __shared_ptr<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2> *this_01;
  uint64_t uVar4;
  reference pvVar5;
  __shared_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2> *this_02;
  undefined1 local_80 [8];
  value_type n;
  key_type local_4c;
  undefined1 local_48 [8];
  mapped_type func_name;
  uint64_t i;
  uint64_t index_local;
  Generator *this_local;
  
  if ((this->is_external_ & 1U) == 0) {
    uVar1 = stmts_count(this);
    if (index < uVar1) {
      this_00 = &std::
                 vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                 ::operator[](&this->stmts_,index)->
                 super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>;
      this_local = (Generator *)
                   std::__shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>::get(this_00);
    }
    else {
      uVar1 = stmts_count(this);
      sVar2 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>_>_>_>
              ::size(&this->funcs_);
      if (index < uVar1 + sVar2) {
        uVar1 = stmts_count(this);
        func_name.field_2._8_8_ = index - uVar1;
        local_4c = func_name.field_2._8_4_;
        pmVar3 = std::
                 map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::at(&this->func_index_,&local_4c);
        std::__cxx11::string::string((string *)local_48,(string *)pmVar3);
        this_01 = &std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>_>_>_>
                   ::at(&this->funcs_,(key_type *)local_48)->
                   super___shared_ptr<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2>;
        this_local = (Generator *)
                     std::__shared_ptr<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2>::get
                               (this_01);
        std::__cxx11::string::~string((string *)local_48);
      }
      else {
        uVar1 = stmts_count(this);
        sVar2 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>_>_>_>
                ::size(&this->funcs_);
        uVar4 = get_child_generator_size(this);
        if (index < uVar1 + sVar2 + uVar4) {
          uVar1 = stmts_count(this);
          sVar2 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>_>_>_>
                  ::size(&this->funcs_);
          pvVar5 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[](&this->children_names_,(index - uVar1) - sVar2);
          std::__cxx11::string::string((string *)local_80,(string *)pvVar5);
          this_02 = &std::
                     unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Generator>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Generator>_>_>_>
                     ::at(&this->children_,(key_type *)local_80)->
                     super___shared_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2>;
          this_local = std::__shared_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2>::get
                                 (this_02);
          std::__cxx11::string::~string((string *)local_80);
        }
        else {
          this_local = (Generator *)0x0;
        }
      }
    }
  }
  else {
    this_local = (Generator *)0x0;
  }
  return &this_local->super_IRNode;
}

Assistant:

IRNode *Generator::get_child(uint64_t index) {
    if (is_external_) return nullptr;
    if (index < stmts_count()) {
        return stmts_[index].get();
    } else if (index < stmts_count() + funcs_.size()) {
        auto i = index - stmts_count();
        auto func_name = func_index_.at(i);
        return funcs_.at(func_name).get();
    } else if (index < stmts_count() + funcs_.size() + get_child_generator_size()) {
        auto n = children_names_[index - stmts_count() - funcs_.size()];
        return children_.at(n).get();
    } else {
        return nullptr;
    }
}